

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_predictor_4x4_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  uint5 uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  int iVar11;
  
  uVar1 = *(uint *)above;
  auVar3[0xc] = (char)(uVar1 >> 0x18);
  auVar3._0_12_ = ZEXT712(0);
  uVar8 = CONCAT32(auVar3._10_3_,(ushort)(byte)(uVar1 >> 0x10));
  auVar10._5_8_ = 0;
  auVar10._0_5_ = uVar8;
  uVar2 = *(undefined4 *)left;
  uVar7 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar7;
  auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
  auVar5[8] = (char)((uint)uVar2 >> 0x10);
  auVar5._0_8_ = uVar7;
  auVar5[9] = 0;
  auVar5._10_3_ = auVar4._10_3_;
  auVar9._5_8_ = 0;
  auVar9._0_5_ = auVar5._8_5_;
  auVar6[4] = (char)((uint)uVar2 >> 8);
  auVar6._0_4_ = (int)uVar7;
  auVar6[5] = 0;
  auVar6._6_7_ = SUB137(auVar9 << 0x40,6);
  iVar11 = ((uint)(uint3)(auVar4._10_3_ >> 0x10) + auVar6._4_4_ +
            auVar5._8_4_ +
            (int)uVar7 +
            (uint)(uint3)(auVar3._10_3_ >> 0x10) +
            (int)CONCAT72(SUB137(auVar10 << 0x40,6),(ushort)(byte)(uVar1 >> 8)) +
            (int)uVar8 + (uVar1 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
  *(int *)dst = iVar11;
  *(int *)(dst + stride) = iVar11;
  *(int *)(dst + stride * 2) = iVar11;
  *(int *)(dst + stride * 3) = iVar11;
  return;
}

Assistant:

static inline void dc_predictor(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                const uint8_t *above, const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  const int count = bw + bh;

  for (i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (i = 0; i < bh; i++) {
    sum += left[i];
  }

  expected_dc = (sum + (count >> 1)) / count;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}